

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

float __thiscall
tcu::ConstPixelBufferAccess::sample1DCompare
          (ConstPixelBufferAccess *this,Sampler *sampler,FilterMode filter,float ref,float s,
          IVec2 *offset)

{
  int iVar1;
  WrapMode mode;
  CompareMode compare;
  bool isFixedPoint;
  int j;
  int iVar2;
  int i;
  float fVar3;
  float fVar4;
  float fVar5;
  Vec4 p0Clr;
  Vec4 p1Clr;
  Vec4 local_50;
  Vec4 local_40;
  
  isFixedPoint = isFixedPointDepthTextureFormat(&this->m_format);
  if (sampler->normalizedCoords == true) {
    s = unnormalize(sampler->wrapS,s,(this->m_size).m_data[0]);
  }
  if (filter != LINEAR) {
    if (filter != NEAREST) {
      return 0.0;
    }
    sampleNearest1D((tcu *)&local_50,this,sampler,s,offset);
    fVar3 = execCompare(&local_50,sampler->compare,sampler->compareChannel,ref,isFixedPoint);
    return fVar3;
  }
  iVar1 = (this->m_size).m_data[0];
  fVar3 = floorf(s + -0.5);
  iVar2 = offset->m_data[0];
  mode = sampler->wrapS;
  j = wrap(mode,iVar2 + (int)fVar3,iVar1);
  iVar2 = wrap(mode,iVar2 + (int)fVar3 + 1,iVar1);
  i = (int)this;
  if (mode == CLAMP_TO_BORDER) {
    if (j < iVar1 && -1 < j) {
      lookup((ConstPixelBufferAccess *)&local_50,i,j,offset->m_data[1]);
    }
    else {
      lookupBorder((tcu *)&local_50,&this->m_format,sampler);
    }
    if (iVar1 <= iVar2 || iVar2 < 0) {
      lookupBorder((tcu *)&local_40,&this->m_format,sampler);
      goto LAB_003031e2;
    }
  }
  else {
    lookup((ConstPixelBufferAccess *)&local_50,i,j,offset->m_data[1]);
  }
  lookup((ConstPixelBufferAccess *)&local_40,i,iVar2,offset->m_data[1]);
LAB_003031e2:
  fVar3 = (s + -0.5) - fVar3;
  compare = sampler->compare;
  iVar1 = sampler->compareChannel;
  fVar4 = execCompare(&local_50,compare,iVar1,ref,isFixedPoint);
  fVar5 = execCompare(&local_40,compare,iVar1,ref,isFixedPoint);
  return (1.0 - fVar3) * fVar4 + fVar5 * fVar3;
}

Assistant:

float ConstPixelBufferAccess::sample1DCompare (const Sampler& sampler, Sampler::FilterMode filter, float ref, float s, const IVec2& offset) const
{
	// check selected layer exists
	// \note offset.x is X offset, offset.y is the selected layer
	DE_ASSERT(de::inBounds(offset.y(), 0, m_size.y()));

	// Format information for comparison function
	const bool isFixedPointDepth = isFixedPointDepthTextureFormat(m_format);

	// Non-normalized coordinates.
	float u = s;

	if (sampler.normalizedCoords)
		u = unnormalize(sampler.wrapS, s, m_size.x());

	switch (filter)
	{
		case Sampler::NEAREST:	return execCompare(sampleNearest1D(*this, sampler, u, offset), sampler.compare, sampler.compareChannel, ref, isFixedPointDepth);
		case Sampler::LINEAR:	return sampleLinear1DCompare(*this, sampler, ref, u, offset, isFixedPointDepth);
		default:
			DE_ASSERT(DE_FALSE);
			return 0.0f;
	}
}